

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O3

void duckdb::RLEScanPartialInternal<unsigned_char,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  byte bVar1;
  uint uVar2;
  _func_int *p_Var3;
  idx_t iVar4;
  data_ptr_t pdVar5;
  pointer pSVar6;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  _func_int **pp_Var9;
  ulong uVar10;
  ulong __n;
  ulong uVar11;
  
  pSVar6 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)(pSVar6 + 3));
  p_Var3 = pSVar6[3]._vptr_SegmentScanState[2];
  iVar4 = segment->offset;
  uVar2 = *(uint *)&pSVar6[6]._vptr_SegmentScanState;
  pdVar5 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar10 = scan_count + result_offset;
  if (result_offset < uVar10) {
    pp_Var7 = pSVar6[4]._vptr_SegmentScanState;
    pp_Var8 = pSVar6[5]._vptr_SegmentScanState;
    do {
      pp_Var9 = (_func_int **)(ulong)*(ushort *)(p_Var3 + (long)pp_Var7 * 2 + uVar2 + iVar4);
      __n = (long)pp_Var9 - (long)pp_Var8;
      uVar11 = uVar10 - result_offset;
      bVar1 = (byte)(p_Var3 + iVar4 + 8)[(long)pp_Var7];
      if (uVar11 < __n) {
        if (uVar10 != result_offset) {
          switchD_010444a0::default(pdVar5 + result_offset,(uint)bVar1,uVar11 + (uVar11 == 0));
          pp_Var8 = pSVar6[5]._vptr_SegmentScanState;
        }
        pSVar6[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var8 + uVar11);
        return;
      }
      if (pp_Var9 != pp_Var8) {
        switchD_010444a0::default(pdVar5 + result_offset,(uint)bVar1,__n);
        pp_Var7 = pSVar6[4]._vptr_SegmentScanState;
      }
      result_offset = result_offset + __n;
      pp_Var7 = (_func_int **)((long)pp_Var7 + 1);
      pSVar6[4]._vptr_SegmentScanState = pp_Var7;
      pSVar6[5]._vptr_SegmentScanState = (_func_int **)0x0;
      pp_Var8 = (_func_int **)0x0;
    } while (result_offset < uVar10);
  }
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}